

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void tinygltf::SerializeGltfModel(Model *model,json *o)

{
  PerspectiveCamera *obj;
  anon_struct_280_7_93ebfc74_for_indices *obj_00;
  PbrMetallicRoughness *obj_01;
  Accessor *obj_02;
  Animation *obj_03;
  Material *obj_04;
  Primitive *obj_05;
  Texture *obj_06;
  Sampler *obj_07;
  Light *obj_08;
  AudioEmitter *obj_09;
  AudioSource *obj_10;
  pointer pAVar1;
  pointer pdVar2;
  pointer pAVar3;
  pointer pPVar4;
  pointer pTVar5;
  pointer pSVar6;
  pointer pLVar7;
  pointer pAVar8;
  pointer pAVar9;
  pointer pMVar10;
  pointer pbVar11;
  bool bVar12;
  int iVar13;
  reference pbVar14;
  Mesh *obj_11;
  _Base_ptr p_Var15;
  undefined8 uVar16;
  reference pbVar17;
  pointer pMVar18;
  Node *obj_12;
  Scene *obj_13;
  ulong uVar19;
  Camera *obj_14;
  pointer pbVar20;
  Skin *obj_15;
  char *pcVar21;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  pointer pNVar22;
  pointer pNVar23;
  pointer pMVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  pointer pdVar28;
  Sparse *pSVar29;
  pointer pbVar30;
  uint uVar31;
  BufferView *obj_16;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<int,_std::allocator<int>_> values;
  json animation;
  json sparse;
  undefined1 local_310 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionsUsed;
  json indices;
  json asset;
  allocator local_2b1;
  Sparse *local_2b0;
  json mesh;
  string type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  pointer local_268;
  _Alloc_hider _Stack_260;
  pointer local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_250;
  pointer pVStack_240;
  undefined1 local_230 [136];
  Value local_1a8;
  ExtensionMap local_110 [3];
  json sources;
  json source;
  
  if ((model->accessors).super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (model->accessors).super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar31 = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&extensionsUsed,(nullptr_t)0x0);
    while( true ) {
      uVar19 = (ulong)uVar31;
      if ((ulong)(((long)(model->accessors).
                         super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(model->accessors).
                        super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x4c0) <= uVar19) break;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&asset,(nullptr_t)0x0);
      pAVar1 = (model->accessors).
               super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>._M_impl.
               super__Vector_impl_data._M_start;
      obj_02 = pAVar1 + uVar19;
      if (-1 < pAVar1[uVar19].bufferView) {
        std::__cxx11::string::string((string *)&type,"bufferView",(allocator *)&values);
        SerializeNumberProperty<int>(&type,obj_02->bufferView,&asset);
        std::__cxx11::string::~string((string *)&type);
      }
      if (obj_02->byteOffset != 0) {
        std::__cxx11::string::string((string *)&type,"byteOffset",(allocator *)&values);
        SerializeNumberProperty<unsigned_long>(&type,obj_02->byteOffset,&asset);
        std::__cxx11::string::~string((string *)&type);
      }
      std::__cxx11::string::string((string *)&type,"componentType",(allocator *)&values);
      SerializeNumberProperty<int>(&type,obj_02->componentType,&asset);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::string((string *)&type,"count",(allocator *)&values);
      SerializeNumberProperty<unsigned_long>(&type,obj_02->count,&asset);
      std::__cxx11::string::~string((string *)&type);
      if ((obj_02->componentType == 0x140a) || (obj_02->componentType == 0x1406)) {
        std::__cxx11::string::string((string *)&type,"min",(allocator *)&values);
        SerializeNumberArrayProperty<double>(&type,&obj_02->minValues,&asset);
        std::__cxx11::string::~string((string *)&type);
        std::__cxx11::string::string((string *)&type,"max",(allocator *)&values);
        SerializeNumberArrayProperty<double>(&type,&obj_02->maxValues,&asset);
        std::__cxx11::string::~string((string *)&type);
      }
      else {
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        pdVar2 = (obj_02->minValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar28 = (obj_02->minValues).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start; pdVar28 != pdVar2;
            pdVar28 = pdVar28 + 1) {
          type._M_dataplus._M_p._0_4_ = (int)*pdVar28;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&values,(int *)&type);
        }
        std::__cxx11::string::string((string *)&type,"min",(allocator *)&sparse);
        SerializeNumberArrayProperty<int>(&type,&values,&asset);
        std::__cxx11::string::~string((string *)&type);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&values);
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        pdVar2 = (obj_02->maxValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar28 = (obj_02->maxValues).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start; pdVar28 != pdVar2;
            pdVar28 = pdVar28 + 1) {
          type._M_dataplus._M_p._0_4_ = (int)*pdVar28;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&values,(int *)&type);
        }
        std::__cxx11::string::string((string *)&type,"max",(allocator *)&sparse);
        SerializeNumberArrayProperty<int>(&type,&values,&asset);
        std::__cxx11::string::~string((string *)&type);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&values);
      }
      if (obj_02->normalized == true) {
        std::__cxx11::string::string((string *)&values,"normalized",(allocator *)&sparse);
        local_230[0x28] = obj_02->normalized;
        type._M_dataplus._M_p = (pointer)0x3;
        type._M_string_length = 0;
        type.field_2._M_allocated_capacity = (size_type)&local_278;
        type.field_2._8_8_ = 0;
        local_278._M_local_buf[0] = '\0';
        local_230._0_4_ = _S_red;
        local_230._8_8_ = (pointer)0x0;
        aStack_250._8_8_ = (pointer)0x0;
        pVStack_240 = (pointer)0x0;
        local_258 = (pointer)0x0;
        aStack_250._M_allocated_capacity = 0;
        local_268 = (pointer)0x0;
        _Stack_260._M_p = (pointer)0x0;
        local_230._16_8_ = local_230;
        local_230._32_8_ = 0;
        local_230._24_8_ = local_230._16_8_;
        SerializeValue((string *)&values,(Value *)&type,&asset);
        Value::~Value((Value *)&type);
        std::__cxx11::string::~string((string *)&values);
      }
      type._M_dataplus._M_p = (pointer)&type.field_2;
      type._M_string_length = 0;
      type.field_2._M_allocated_capacity = type.field_2._M_allocated_capacity & 0xffffffffffffff00;
      iVar13 = obj_02->type;
      if (((((iVar13 == 2) || (iVar13 == 3)) || (iVar13 == 4)) ||
          ((iVar13 == 0x22 || (iVar13 == 0x23)))) || ((iVar13 == 0x24 || (iVar13 == 0x41)))) {
        std::__cxx11::string::assign((char *)&type);
      }
      std::__cxx11::string::string((string *)&values,"type",(allocator *)&sparse);
      SerializeStringProperty((string *)&values,&type,&asset);
      std::__cxx11::string::~string((string *)&values);
      if ((obj_02->name)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&values,"name",(allocator *)&sparse);
        SerializeStringProperty((string *)&values,&obj_02->name,&asset);
        std::__cxx11::string::~string((string *)&values);
      }
      SerializeExtrasAndExtensions<tinygltf::Accessor>(obj_02,&asset);
      if ((obj_02->sparse).isSparse == true) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&sparse,(nullptr_t)0x0);
        std::__cxx11::string::string((string *)&values,"count",(allocator *)&indices);
        local_2b0 = &obj_02->sparse;
        SerializeNumberProperty<int>((string *)&values,local_2b0->count,&sparse);
        std::__cxx11::string::~string((string *)&values);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&indices,(nullptr_t)0x0);
        std::__cxx11::string::string((string *)&values,"bufferView",(allocator *)&animation);
        SerializeNumberProperty<int>((string *)&values,(obj_02->sparse).indices.bufferView,&indices)
        ;
        std::__cxx11::string::~string((string *)&values);
        std::__cxx11::string::string((string *)&values,"byteOffset",(allocator *)&animation);
        obj_00 = &(obj_02->sparse).indices;
        SerializeNumberProperty<unsigned_long>((string *)&values,obj_00->byteOffset,&indices);
        std::__cxx11::string::~string((string *)&values);
        std::__cxx11::string::string((string *)&values,"componentType",(allocator *)&animation);
        SerializeNumberProperty<int>
                  ((string *)&values,(obj_02->sparse).indices.componentType,&indices);
        std::__cxx11::string::~string((string *)&values);
        SerializeExtrasAndExtensions<tinygltf::Accessor::Sparse::_unnamed_type_1_>(obj_00,&indices);
        detail::JsonAddMember(&sparse,"indices",&indices);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&indices);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&indices,(nullptr_t)0x0);
        std::__cxx11::string::string((string *)&values,"bufferView",(allocator *)&animation);
        SerializeNumberProperty<int>((string *)&values,(obj_02->sparse).values.bufferView,&indices);
        std::__cxx11::string::~string((string *)&values);
        std::__cxx11::string::string((string *)&values,"byteOffset",(allocator *)&animation);
        SerializeNumberProperty<unsigned_long>
                  ((string *)&values,(obj_02->sparse).values.byteOffset,&indices);
        std::__cxx11::string::~string((string *)&values);
        SerializeExtrasAndExtensions<tinygltf::Accessor::Sparse::_unnamed_type_2_>
                  (&(obj_02->sparse).values,&indices);
        detail::JsonAddMember(&sparse,"values",&indices);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&indices);
        SerializeExtrasAndExtensions<tinygltf::Accessor::Sparse>(local_2b0,&sparse);
        detail::JsonAddMember(&asset,"sparse",&sparse);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&sparse);
      }
      std::__cxx11::string::~string((string *)&type);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&extensionsUsed,&asset);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&asset);
      uVar31 = uVar31 + 1;
    }
    detail::JsonAddMember(o,"accessors",(json *)&extensionsUsed);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&extensionsUsed);
  }
  if ((model->animations).
      super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->animations).
      super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar31 = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&asset,(nullptr_t)0x0);
    while( true ) {
      pSVar29 = (Sparse *)(ulong)uVar31;
      pAVar3 = (model->animations).
               super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl
               .super__Vector_impl_data._M_start;
      if ((Sparse *)
          (((long)(model->animations).
                  super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pAVar3) / 0x158) <= pSVar29)
      break;
      if (*(pointer *)
           ((long)&pAVar3[(long)pSVar29].channels.
                   super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                   ._M_impl + 8) !=
          *(pointer *)
           &pAVar3[(long)pSVar29].channels.
            super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
            ._M_impl) {
        local_2b0 = pSVar29;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&animation,(nullptr_t)0x0);
        pAVar3 = (model->animations).
                 super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        obj_03 = pAVar3 + (long)pSVar29;
        if (pAVar3[(long)pSVar29].name._M_string_length != 0) {
          std::__cxx11::string::string((string *)&type,"name",(allocator *)&values);
          SerializeStringProperty(&type,&obj_03->name,&animation);
          std::__cxx11::string::~string((string *)&type);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&indices,(nullptr_t)0x0);
        for (uVar31 = 0;
            (ulong)uVar31 <
            (ulong)(((long)(obj_03->channels).
                           super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(obj_03->channels).
                          super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x238); uVar31 = uVar31 + 1)
        {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&extensionsUsed,(nullptr_t)0x0);
          AnimationChannel::AnimationChannel
                    ((AnimationChannel *)&type,
                     (obj_03->channels).
                     super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar31);
          std::__cxx11::string::string((string *)&values,"sampler",(allocator *)&sparse);
          SerializeNumberProperty<int>
                    ((string *)&values,(int)type._M_dataplus._M_p,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&extensionsUsed);
          std::__cxx11::string::~string((string *)&values);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json(&sparse,(nullptr_t)0x0);
          if (-1 < (long)type._M_dataplus._M_p) {
            std::__cxx11::string::string((string *)&values,"node",(allocator *)&mesh);
            SerializeNumberProperty<int>((string *)&values,type._M_dataplus._M_p._4_4_,&sparse);
            std::__cxx11::string::~string((string *)&values);
          }
          std::__cxx11::string::string((string *)&values,"path",(allocator *)&mesh);
          SerializeStringProperty((string *)&values,(string *)&type._M_string_length,&sparse);
          std::__cxx11::string::~string((string *)&values);
          SerializeExtensionMap(local_110,&sparse);
          SerializeExtras((Value *)(local_230 + 0x88),&sparse);
          detail::JsonAddMember
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&extensionsUsed,"target",&sparse);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&sparse);
          SerializeExtrasAndExtensions<tinygltf::AnimationChannel>
                    ((AnimationChannel *)&type,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&extensionsUsed);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::push_back(&indices,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&extensionsUsed);
          AnimationChannel::~AnimationChannel((AnimationChannel *)&type);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&extensionsUsed);
        }
        detail::JsonAddMember(&animation,"channels",&indices);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&indices);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&sparse,(nullptr_t)0x0);
        for (uVar31 = 0;
            (ulong)uVar31 <
            (ulong)(((long)(obj_03->samplers).
                           super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(obj_03->samplers).
                          super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x130); uVar31 = uVar31 + 1)
        {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json(&indices,(nullptr_t)0x0);
          AnimationSampler::AnimationSampler
                    ((AnimationSampler *)&type,
                     (obj_03->samplers).
                     super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar31);
          std::__cxx11::string::string((string *)&values,"input",(allocator *)&extensionsUsed);
          SerializeNumberProperty<int>((string *)&values,(int)type._M_dataplus._M_p,&indices);
          std::__cxx11::string::~string((string *)&values);
          std::__cxx11::string::string((string *)&values,"output",(allocator *)&extensionsUsed);
          SerializeNumberProperty<int>((string *)&values,type._M_dataplus._M_p._4_4_,&indices);
          std::__cxx11::string::~string((string *)&values);
          std::__cxx11::string::string
                    ((string *)&values,"interpolation",(allocator *)&extensionsUsed);
          SerializeStringProperty((string *)&values,(string *)&type._M_string_length,&indices);
          std::__cxx11::string::~string((string *)&values);
          SerializeExtrasAndExtensions<tinygltf::AnimationSampler>
                    ((AnimationSampler *)&type,&indices);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::push_back(&sparse,&indices);
          AnimationSampler::~AnimationSampler((AnimationSampler *)&type);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&indices);
        }
        detail::JsonAddMember(&animation,"samplers",&sparse);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&sparse);
        SerializeExtrasAndExtensions<tinygltf::Animation>(obj_03,&animation);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back(&asset,&animation);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&animation);
        uVar31 = (uint)local_2b0;
      }
      uVar31 = uVar31 + 1;
    }
    detail::JsonAddMember(o,"animations",&asset);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&asset);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&asset,(nullptr_t)0x0);
  if ((model->asset).generator._M_string_length != 0) {
    std::__cxx11::string::string((string *)&type,"generator",(allocator *)&values);
    SerializeStringProperty(&type,&(model->asset).generator,&asset);
    std::__cxx11::string::~string((string *)&type);
  }
  if ((model->asset).copyright._M_string_length != 0) {
    std::__cxx11::string::string((string *)&type,"copyright",(allocator *)&values);
    SerializeStringProperty(&type,&(model->asset).copyright,&asset);
    std::__cxx11::string::~string((string *)&type);
  }
  std::__cxx11::string::string((string *)&type,(string *)&model->asset);
  if (type._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&type);
  }
  std::__cxx11::string::string((string *)&values,"version",(allocator *)&sparse);
  SerializeStringProperty((string *)&values,&type,&asset);
  std::__cxx11::string::~string((string *)&values);
  SerializeExtrasAndExtensions<tinygltf::Asset>(&model->asset,&asset);
  std::__cxx11::string::~string((string *)&type);
  detail::JsonAddMember(o,"asset",&asset);
  if ((model->bufferViews).
      super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->bufferViews).
      super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>._M_impl.
      super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&values,(nullptr_t)0x0);
    for (uVar31 = 0;
        (ulong)uVar31 <
        (ulong)(((long)(model->bufferViews).
                       super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->bufferViews).
                      super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x158); uVar31 = uVar31 + 1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&sparse,(nullptr_t)0x0);
      obj_16 = (model->bufferViews).
               super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
      std::__cxx11::string::string((string *)&type,"buffer",(allocator *)&indices);
      SerializeNumberProperty<int>(&type,obj_16->buffer,&sparse);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::string((string *)&type,"byteLength",(allocator *)&indices);
      SerializeNumberProperty<unsigned_long>(&type,obj_16->byteLength,&sparse);
      std::__cxx11::string::~string((string *)&type);
      if (3 < obj_16->byteStride) {
        std::__cxx11::string::string((string *)&type,"byteStride",(allocator *)&indices);
        SerializeNumberProperty<unsigned_long>(&type,obj_16->byteStride,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if (obj_16->byteOffset != 0) {
        std::__cxx11::string::string((string *)&type,"byteOffset",(allocator *)&indices);
        SerializeNumberProperty<unsigned_long>(&type,obj_16->byteOffset,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if ((obj_16->target & 0xfffffffeU) == 0x8892) {
        std::__cxx11::string::string((string *)&type,"target",(allocator *)&indices);
        SerializeNumberProperty<int>(&type,obj_16->target,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if ((obj_16->name)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"name",(allocator *)&indices);
        SerializeStringProperty(&type,&obj_16->name,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      SerializeExtrasAndExtensions<tinygltf::BufferView>(obj_16,&sparse);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&values,&sparse);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&sparse);
    }
    detail::JsonAddMember(o,"bufferViews",(json *)&values);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&values);
  }
  if ((model->extensionsRequired).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (model->extensionsRequired).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string((string *)&type,"extensionsRequired",(allocator *)&values);
    SerializeStringArrayProperty(&type,&model->extensionsRequired,o);
    std::__cxx11::string::~string((string *)&type);
  }
  if ((model->materials).super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (model->materials).super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&extensionsUsed,(nullptr_t)0x0);
    for (uVar31 = 0; uVar19 = (ulong)uVar31,
        uVar19 < (ulong)(((long)(model->materials).
                                super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(model->materials).
                               super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x878);
        uVar31 = uVar31 + 1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&animation,(nullptr_t)0x0);
      pMVar24 = (model->materials).
                super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
                super__Vector_impl_data._M_start;
      obj_04 = pMVar24 + uVar19;
      if (pMVar24[uVar19].name._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"name",(allocator *)&values);
        SerializeStringProperty(&type,&obj_04->name,&animation);
        std::__cxx11::string::~string((string *)&type);
      }
      if (1e-12 <= ABS(0.5 - obj_04->alphaCutoff)) {
        std::__cxx11::string::string((string *)&type,"alphaCutoff",(allocator *)&values);
        SerializeNumberProperty<double>(&type,obj_04->alphaCutoff,&animation);
        std::__cxx11::string::~string((string *)&type);
      }
      iVar13 = std::__cxx11::string::compare((char *)&obj_04->alphaMode);
      if (iVar13 != 0) {
        std::__cxx11::string::string((string *)&type,"alphaMode",(allocator *)&values);
        SerializeStringProperty(&type,&obj_04->alphaMode,&animation);
        std::__cxx11::string::~string((string *)&type);
      }
      if (obj_04->doubleSided == true) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json<const_bool_&,_bool,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&type,&obj_04->doubleSided);
        detail::JsonAddMember(&animation,"doubleSided",(json *)&type);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&type);
      }
      if (-1 < (obj_04->normalTexture).index) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values,(nullptr_t)0x0);
        std::__cxx11::string::string((string *)&type,"index",(allocator *)&sparse);
        SerializeNumberProperty<int>(&type,(obj_04->normalTexture).index,(json *)&values);
        std::__cxx11::string::~string((string *)&type);
        if ((obj_04->normalTexture).texCoord != 0) {
          std::__cxx11::string::string((string *)&type,"texCoord",(allocator *)&sparse);
          SerializeNumberProperty<int>(&type,(obj_04->normalTexture).texCoord,(json *)&values);
          std::__cxx11::string::~string((string *)&type);
        }
        if (1e-12 <= ABS(1.0 - (obj_04->normalTexture).scale)) {
          std::__cxx11::string::string((string *)&type,"scale",(allocator *)&sparse);
          SerializeNumberProperty<double>(&type,(obj_04->normalTexture).scale,(json *)&values);
          std::__cxx11::string::~string((string *)&type);
        }
        SerializeExtrasAndExtensions<tinygltf::NormalTextureInfo>
                  (&obj_04->normalTexture,(json *)&values);
        detail::JsonAddMember(&animation,"normalTexture",(json *)&values);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&values);
      }
      if (-1 < (obj_04->occlusionTexture).index) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values,(nullptr_t)0x0);
        std::__cxx11::string::string((string *)&type,"index",(allocator *)&sparse);
        SerializeNumberProperty<int>(&type,(obj_04->occlusionTexture).index,(json *)&values);
        std::__cxx11::string::~string((string *)&type);
        if ((obj_04->occlusionTexture).texCoord != 0) {
          std::__cxx11::string::string((string *)&type,"texCoord",(allocator *)&sparse);
          SerializeNumberProperty<int>(&type,(obj_04->occlusionTexture).texCoord,(json *)&values);
          std::__cxx11::string::~string((string *)&type);
        }
        if (1e-12 <= ABS(1.0 - (obj_04->occlusionTexture).strength)) {
          std::__cxx11::string::string((string *)&type,"strength",(allocator *)&sparse);
          SerializeNumberProperty<double>(&type,(obj_04->occlusionTexture).strength,(json *)&values)
          ;
          std::__cxx11::string::~string((string *)&type);
        }
        SerializeExtrasAndExtensions<tinygltf::OcclusionTextureInfo>
                  (&obj_04->occlusionTexture,(json *)&values);
        detail::JsonAddMember(&animation,"occlusionTexture",(json *)&values);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&values);
      }
      if (-1 < (obj_04->emissiveTexture).index) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&type,(nullptr_t)0x0);
        SerializeGltfTextureInfo(&obj_04->emissiveTexture,(json *)&type);
        detail::JsonAddMember(&animation,"emissiveTexture",(json *)&type);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&type);
      }
      type._M_dataplus._M_p = (pointer)0x0;
      type._M_string_length = 0;
      type.field_2._M_allocated_capacity = 0;
      __l._M_len = 3;
      __l._M_array = (iterator)&type;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&sparse,__l,(allocator_type *)&values);
      bVar12 = Equals(&obj_04->emissiveFactor,(vector<double,_std::allocator<double>_> *)&sparse);
      if (!bVar12) {
        std::__cxx11::string::string((string *)&type,"emissiveFactor",(allocator *)&values);
        SerializeNumberArrayProperty<double>(&type,&obj_04->emissiveFactor,&animation);
        std::__cxx11::string::~string((string *)&type);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&indices,(nullptr_t)0x0);
      type.field_2._M_allocated_capacity = 0x3ff0000000000000;
      type.field_2._8_8_ = 0x3ff0000000000000;
      type._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      type._M_string_length = 0x3ff0000000000000;
      __l_00._M_len = 4;
      __l_00._M_array = (iterator)&type;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&values,__l_00,(allocator_type *)&mesh);
      obj_01 = &obj_04->pbrMetallicRoughness;
      bVar12 = Equals(&obj_01->baseColorFactor,(vector<double,_std::allocator<double>_> *)&values);
      if (!bVar12) {
        std::__cxx11::string::string((string *)&type,"baseColorFactor",(allocator *)&mesh);
        SerializeNumberArrayProperty<double>(&type,&obj_01->baseColorFactor,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      if (1e-12 <= ABS(1.0 - (obj_04->pbrMetallicRoughness).metallicFactor)) {
        std::__cxx11::string::string((string *)&type,"metallicFactor",(allocator *)&mesh);
        SerializeNumberProperty<double>
                  (&type,(obj_04->pbrMetallicRoughness).metallicFactor,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      if (1e-12 <= ABS(1.0 - (obj_04->pbrMetallicRoughness).roughnessFactor)) {
        std::__cxx11::string::string((string *)&type,"roughnessFactor",(allocator *)&mesh);
        SerializeNumberProperty<double>
                  (&type,(obj_04->pbrMetallicRoughness).roughnessFactor,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      if (-1 < (obj_04->pbrMetallicRoughness).baseColorTexture.index) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&type,(nullptr_t)0x0);
        SerializeGltfTextureInfo(&(obj_04->pbrMetallicRoughness).baseColorTexture,(json *)&type);
        detail::JsonAddMember(&indices,"baseColorTexture",(json *)&type);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&type);
      }
      if (-1 < (obj_04->pbrMetallicRoughness).metallicRoughnessTexture.index) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&type,(nullptr_t)0x0);
        SerializeGltfTextureInfo
                  (&(obj_04->pbrMetallicRoughness).metallicRoughnessTexture,(json *)&type);
        detail::JsonAddMember(&indices,"metallicRoughnessTexture",(json *)&type);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&type);
      }
      SerializeExtrasAndExtensions<tinygltf::PbrMetallicRoughness>(obj_01,&indices);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&values);
      if (indices.m_type != null) {
        detail::JsonAddMember(&animation,"pbrMetallicRoughness",&indices);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&indices);
      SerializeExtrasAndExtensions<tinygltf::Material>(obj_04,&animation);
      if ((obj_04->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (obj_04->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        type._M_dataplus._M_p = (pointer)0x0;
        type._M_string_length = 0;
        type.field_2._M_allocated_capacity = 0;
        type.field_2._8_8_ = 0x8000000000000000;
        bVar12 = detail::FindMember(&animation,"extensions",(json_iterator *)&type);
        if (bVar12) {
          pbVar14 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&type);
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          bVar12 = detail::FindMember(pbVar14,"MSFT_lod",(json_iterator *)&values);
          if (bVar12) {
            detail::Erase(pbVar14,(json_iterator *)&values);
          }
          bVar12 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::empty(pbVar14);
          if (bVar12) {
            detail::Erase(&animation,(json_iterator *)&type);
          }
        }
      }
      else {
        type._M_dataplus._M_p = (pointer)0x0;
        type._M_string_length = 0;
        type.field_2._M_allocated_capacity = 0;
        type.field_2._8_8_ = 0x8000000000000000;
        bVar12 = detail::FindMember(&animation,"extensions",(json_iterator *)&type);
        if (!bVar12) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values,(nullptr_t)0x0);
          detail::JsonSetObject((json *)&values);
          detail::JsonAddMember(&animation,"extensions",(json *)&values);
          detail::FindMember(&animation,"extensions",(json_iterator *)&type);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&values);
        }
        pbVar14 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&type);
        bVar12 = detail::FindMember(pbVar14,"MSFT_lod",(json_iterator *)&type);
        if (!bVar12) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values,(nullptr_t)0x0);
          detail::JsonSetObject((json *)&values);
          detail::JsonAddMember(pbVar14,"MSFT_lod",(json *)&values);
          detail::FindMember(pbVar14,"MSFT_lod",(json_iterator *)&type);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&values);
        }
        std::__cxx11::string::string((string *)&values,"ids",(allocator *)&indices);
        pbVar14 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&type);
        SerializeNumberArrayProperty<int>((string *)&values,&obj_04->lods,pbVar14);
        std::__cxx11::string::~string((string *)&values);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&sparse);
      if (animation.m_type == null) {
        detail::JsonSetObject(&animation);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&extensionsUsed,&animation);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&animation);
    }
    detail::JsonAddMember(o,"materials",(json *)&extensionsUsed);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&extensionsUsed);
  }
  if ((model->meshes).super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->meshes).super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
      super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&animation,(nullptr_t)0x0);
    uVar31 = 0;
    while( true ) {
      if ((ulong)(((long)(model->meshes).
                         super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)(model->meshes).
                        super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x158) <= (ulong)uVar31) break;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&mesh,(nullptr_t)0x0);
      uVar27 = 0;
      obj_11 = (model->meshes).super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values,(nullptr_t)0x0);
      while( true ) {
        pSVar29 = (Sparse *)(ulong)uVar27;
        if ((Sparse *)
            (((long)(obj_11->primitives).
                    super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(obj_11->primitives).
                   super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x160) <= pSVar29) break;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&sparse,(nullptr_t)0x0);
        pPVar4 = (obj_11->primitives).
                 super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        obj_05 = pPVar4 + (long)pSVar29;
        local_2b0 = pSVar29;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&type,(nullptr_t)0x0);
        for (p_Var15 = *(_Base_ptr *)((long)&pPVar4[(long)pSVar29].attributes._M_t._M_impl + 0x18);
            p_Var15 !=
            (_Rb_tree_node_base *)((long)&pPVar4[(long)pSVar29].attributes._M_t._M_impl + 8U);
            p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15)) {
          SerializeNumberProperty<int>((string *)(p_Var15 + 1),p_Var15[2]._M_color,(json *)&type);
        }
        detail::JsonAddMember(&sparse,"attributes",(json *)&type);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&type);
        iVar13 = (int)local_2b0;
        if (-1 < obj_05->indices) {
          std::__cxx11::string::string((string *)&type,"indices",(allocator *)&indices);
          SerializeNumberProperty<int>(&type,obj_05->indices,&sparse);
          std::__cxx11::string::~string((string *)&type);
        }
        if (-1 < obj_05->material) {
          std::__cxx11::string::string((string *)&type,"material",(allocator *)&indices);
          SerializeNumberProperty<int>(&type,obj_05->material,&sparse);
          std::__cxx11::string::~string((string *)&type);
        }
        std::__cxx11::string::string((string *)&type,"mode",(allocator *)&indices);
        SerializeNumberProperty<int>(&type,obj_05->mode,&sparse);
        std::__cxx11::string::~string((string *)&type);
        if ((obj_05->targets).
            super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (obj_05->targets).
            super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar27 = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json(&indices,(nullptr_t)0x0);
          while( true ) {
            if ((ulong)(((long)(obj_05->targets).
                               super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(obj_05->targets).
                              super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x30) <= (ulong)uVar27)
            break;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&extensionsUsed,(nullptr_t)0x0);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)&type,&(obj_05->targets).
                                 super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar27]._M_t);
            for (uVar16 = type.field_2._8_8_; (size_type *)uVar16 != &type._M_string_length;
                uVar16 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar16)) {
              SerializeNumberProperty<int>
                        ((string *)(uVar16 + 0x20),((_Rb_tree_node_base *)(uVar16 + 0x40))->_M_color
                         ,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&extensionsUsed);
            }
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::push_back(&indices,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&extensionsUsed);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)&type);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&extensionsUsed);
            uVar27 = uVar27 + 1;
          }
          detail::JsonAddMember(&sparse,"targets",&indices);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&indices);
          iVar13 = (int)local_2b0;
        }
        SerializeExtrasAndExtensions<tinygltf::Primitive>(obj_05,&sparse);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&values,&sparse);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&sparse);
        uVar27 = iVar13 + 1;
      }
      detail::JsonAddMember(&mesh,"primitives",(json *)&values);
      if ((obj_11->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (obj_11->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__cxx11::string::string((string *)&type,"weights",(allocator *)&sparse);
        SerializeNumberArrayProperty<double>(&type,&obj_11->weights,&mesh);
        std::__cxx11::string::~string((string *)&type);
      }
      if ((obj_11->name)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"name",(allocator *)&sparse);
        SerializeStringProperty(&type,&obj_11->name,&mesh);
        std::__cxx11::string::~string((string *)&type);
      }
      SerializeExtrasAndExtensions<tinygltf::Mesh>(obj_11,&mesh);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&values);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back(&animation,&mesh);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&mesh);
      uVar31 = uVar31 + 1;
    }
    detail::JsonAddMember(o,"meshes",&animation);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&animation);
  }
  if ((model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
      super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&sparse,(nullptr_t)0x0);
    for (uVar31 = 0; uVar19 = (ulong)uVar31,
        uVar19 < (ulong)(((long)(model->nodes).
                                super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(model->nodes).
                               super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x1e8);
        uVar31 = uVar31 + 1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&indices,(nullptr_t)0x0);
      pNVar23 = (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pNVar23[uVar19].translation.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl + 8) !=
          *(pointer *)
           &pNVar23[uVar19].translation.super__Vector_base<double,_std::allocator<double>_>._M_impl)
      {
        std::__cxx11::string::string((string *)&type,"translation",(allocator *)&values);
        SerializeNumberArrayProperty<double>(&type,&pNVar23[uVar19].translation,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      obj_12 = pNVar23 + uVar19;
      if ((obj_12->rotation).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (obj_12->rotation).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__cxx11::string::string((string *)&type,"rotation",(allocator *)&values);
        SerializeNumberArrayProperty<double>(&type,&obj_12->rotation,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      if ((obj_12->scale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (obj_12->scale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__cxx11::string::string((string *)&type,"scale",(allocator *)&values);
        SerializeNumberArrayProperty<double>(&type,&obj_12->scale,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      if ((obj_12->matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (obj_12->matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__cxx11::string::string((string *)&type,"matrix",(allocator *)&values);
        SerializeNumberArrayProperty<double>(&type,&obj_12->matrix,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      if (obj_12->mesh != -1) {
        std::__cxx11::string::string((string *)&type,"mesh",(allocator *)&values);
        SerializeNumberProperty<int>(&type,obj_12->mesh,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      if (obj_12->skin != -1) {
        std::__cxx11::string::string((string *)&type,"skin",(allocator *)&values);
        SerializeNumberProperty<int>(&type,obj_12->skin,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      if (obj_12->camera != -1) {
        std::__cxx11::string::string((string *)&type,"camera",(allocator *)&values);
        SerializeNumberProperty<int>(&type,obj_12->camera,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      if ((obj_12->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (obj_12->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__cxx11::string::string((string *)&type,"weights",(allocator *)&values);
        SerializeNumberArrayProperty<double>(&type,&obj_12->weights,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      SerializeExtrasAndExtensions<tinygltf::Node>(obj_12,&indices);
      if (obj_12->light == -1) {
        type._M_dataplus._M_p = (pointer)0x0;
        type._M_string_length = 0;
        type.field_2._M_allocated_capacity = 0;
        type.field_2._8_8_ = 0x8000000000000000;
        bVar12 = detail::FindMember(&indices,"extensions",(json_iterator *)&type);
        if (bVar12) {
          pbVar14 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&type);
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          bVar12 = detail::FindMember(pbVar14,"KHR_lights_punctual",(json_iterator *)&values);
          if (bVar12) {
            detail::Erase(pbVar14,(json_iterator *)&values);
          }
          bVar12 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::empty(pbVar14);
          if (bVar12) {
            detail::Erase(&indices,(json_iterator *)&type);
          }
        }
      }
      else {
        type._M_dataplus._M_p = (pointer)0x0;
        type._M_string_length = 0;
        type.field_2._M_allocated_capacity = 0;
        type.field_2._8_8_ = 0x8000000000000000;
        bVar12 = detail::FindMember(&indices,"extensions",(json_iterator *)&type);
        if (!bVar12) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values,(nullptr_t)0x0);
          detail::JsonSetObject((json *)&values);
          detail::JsonAddMember(&indices,"extensions",(json *)&values);
          detail::FindMember(&indices,"extensions",(json_iterator *)&type);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&values);
        }
        pbVar14 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&type);
        bVar12 = detail::FindMember(pbVar14,"KHR_lights_punctual",(json_iterator *)&type);
        if (!bVar12) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values,(nullptr_t)0x0);
          detail::JsonSetObject((json *)&values);
          detail::JsonAddMember(pbVar14,"KHR_lights_punctual",(json *)&values);
          detail::FindMember(pbVar14,"KHR_lights_punctual",(json_iterator *)&type);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&values);
        }
        std::__cxx11::string::string((string *)&values,"light",(allocator *)&extensionsUsed);
        iVar13 = obj_12->light;
        pbVar14 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&type);
        SerializeNumberProperty<int>((string *)&values,iVar13,pbVar14);
        std::__cxx11::string::~string((string *)&values);
      }
      if (obj_12->emitter == -1) {
        type._M_dataplus._M_p = (pointer)0x0;
        type._M_string_length = 0;
        type.field_2._M_allocated_capacity = 0;
        type.field_2._8_8_ = 0x8000000000000000;
        bVar12 = detail::FindMember(&indices,"extensions",(json_iterator *)&type);
        if (bVar12) {
          pbVar14 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&type);
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          bVar12 = detail::FindMember(pbVar14,"KHR_audio",(json_iterator *)&values);
          if (bVar12) {
            detail::Erase(pbVar14,(json_iterator *)&values);
          }
          bVar12 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::empty(pbVar14);
          if (bVar12) {
            detail::Erase(&indices,(json_iterator *)&type);
          }
        }
      }
      else {
        type._M_dataplus._M_p = (pointer)0x0;
        type._M_string_length = 0;
        type.field_2._M_allocated_capacity = 0;
        type.field_2._8_8_ = 0x8000000000000000;
        bVar12 = detail::FindMember(&indices,"extensions",(json_iterator *)&type);
        if (!bVar12) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values,(nullptr_t)0x0);
          detail::JsonSetObject((json *)&values);
          detail::JsonAddMember(&indices,"extensions",(json *)&values);
          detail::FindMember(&indices,"extensions",(json_iterator *)&type);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&values);
        }
        pbVar14 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&type);
        bVar12 = detail::FindMember(pbVar14,"KHR_audio",(json_iterator *)&type);
        if (!bVar12) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values,(nullptr_t)0x0);
          detail::JsonSetObject((json *)&values);
          detail::JsonAddMember(pbVar14,"KHR_audio",(json *)&values);
          detail::FindMember(pbVar14,"KHR_audio",(json_iterator *)&type);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&values);
        }
        std::__cxx11::string::string((string *)&values,"emitter",(allocator *)&extensionsUsed);
        iVar13 = obj_12->emitter;
        pbVar14 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&type);
        SerializeNumberProperty<int>((string *)&values,iVar13,pbVar14);
        std::__cxx11::string::~string((string *)&values);
      }
      if ((obj_12->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (obj_12->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        type._M_dataplus._M_p = (pointer)0x0;
        type._M_string_length = 0;
        type.field_2._M_allocated_capacity = 0;
        type.field_2._8_8_ = 0x8000000000000000;
        bVar12 = detail::FindMember(&indices,"extensions",(json_iterator *)&type);
        if (bVar12) {
          pbVar14 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&type);
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          bVar12 = detail::FindMember(pbVar14,"MSFT_lod",(json_iterator *)&values);
          if (bVar12) {
            detail::Erase(pbVar14,(json_iterator *)&values);
          }
          bVar12 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::empty(pbVar14);
          if (bVar12) {
            detail::Erase(&indices,(json_iterator *)&type);
          }
        }
      }
      else {
        type._M_dataplus._M_p = (pointer)0x0;
        type._M_string_length = 0;
        type.field_2._M_allocated_capacity = 0;
        type.field_2._8_8_ = 0x8000000000000000;
        bVar12 = detail::FindMember(&indices,"extensions",(json_iterator *)&type);
        if (!bVar12) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values,(nullptr_t)0x0);
          detail::JsonSetObject((json *)&values);
          detail::JsonAddMember(&indices,"extensions",(json *)&values);
          detail::FindMember(&indices,"extensions",(json_iterator *)&type);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&values);
        }
        pbVar14 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&type);
        bVar12 = detail::FindMember(pbVar14,"MSFT_lod",(json_iterator *)&type);
        if (!bVar12) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values,(nullptr_t)0x0);
          detail::JsonSetObject((json *)&values);
          detail::JsonAddMember(pbVar14,"MSFT_lod",(json *)&values);
          detail::FindMember(pbVar14,"MSFT_lod",(json_iterator *)&type);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&values);
        }
        std::__cxx11::string::string((string *)&values,"ids",(allocator *)&extensionsUsed);
        pbVar14 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&type);
        SerializeNumberArrayProperty<int>((string *)&values,&obj_12->lods,pbVar14);
        std::__cxx11::string::~string((string *)&values);
      }
      if ((obj_12->name)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"name",(allocator *)&values);
        SerializeStringProperty(&type,&obj_12->name,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      std::__cxx11::string::string((string *)&type,"children",(allocator *)&values);
      SerializeNumberArrayProperty<int>(&type,&obj_12->children,&indices);
      std::__cxx11::string::~string((string *)&type);
      if (indices.m_type == null) {
        detail::JsonSetObject(&indices);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back(&sparse,&indices);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&indices);
    }
    detail::JsonAddMember(o,"nodes",&sparse);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&sparse);
  }
  if (-1 < model->defaultScene) {
    std::__cxx11::string::string((string *)&type,"scene",(allocator *)&values);
    SerializeNumberProperty<int>(&type,model->defaultScene,o);
    std::__cxx11::string::~string((string *)&type);
  }
  if ((model->scenes).super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->scenes).super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>._M_impl.
      super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&sparse,(nullptr_t)0x0);
    for (uVar31 = 0;
        (ulong)uVar31 <
        (ulong)(((long)(model->scenes).
                       super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)(model->scenes).
                      super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x158); uVar31 = uVar31 + 1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&indices,(nullptr_t)0x0);
      obj_13 = (model->scenes).super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar31;
      std::__cxx11::string::string((string *)&type,"nodes",(allocator *)&values);
      SerializeNumberArrayProperty<int>(&type,&obj_13->nodes,&indices);
      std::__cxx11::string::~string((string *)&type);
      if ((obj_13->name)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"name",(allocator *)&values);
        SerializeStringProperty(&type,&obj_13->name,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      SerializeExtrasAndExtensions<tinygltf::Scene>(obj_13,&indices);
      if ((obj_13->audioEmitters).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (obj_13->audioEmitters).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        type._M_dataplus._M_p = (pointer)0x0;
        type._M_string_length = 0;
        type.field_2._M_allocated_capacity = 0;
        type.field_2._8_8_ = 0x8000000000000000;
        bVar12 = detail::FindMember(&indices,"extensions",(json_iterator *)&type);
        if (bVar12) {
          pbVar14 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&type);
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          bVar12 = detail::FindMember(pbVar14,"KHR_audio",(json_iterator *)&values);
          if (bVar12) {
            detail::Erase(pbVar14,(json_iterator *)&values);
          }
          bVar12 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::empty(pbVar14);
          if (bVar12) {
            detail::Erase(&indices,(json_iterator *)&type);
          }
        }
      }
      else {
        type._M_dataplus._M_p = (pointer)0x0;
        type._M_string_length = 0;
        type.field_2._M_allocated_capacity = 0;
        type.field_2._8_8_ = 0x8000000000000000;
        bVar12 = detail::FindMember(&indices,"extensions",(json_iterator *)&type);
        if (!bVar12) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values,(nullptr_t)0x0);
          detail::JsonSetObject((json *)&values);
          detail::JsonAddMember(&indices,"extensions",(json *)&values);
          detail::FindMember(&indices,"extensions",(json_iterator *)&type);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&values);
        }
        pbVar14 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&type);
        bVar12 = detail::FindMember(pbVar14,"KHR_audio",(json_iterator *)&type);
        if (!bVar12) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values,(nullptr_t)0x0);
          detail::JsonSetObject((json *)&values);
          detail::JsonAddMember(pbVar14,"KHR_audio",(json *)&values);
          detail::FindMember(&indices,"KHR_audio",(json_iterator *)&type);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&values);
        }
        std::__cxx11::string::string((string *)&values,"emitters",(allocator *)&extensionsUsed);
        pbVar14 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&type);
        SerializeNumberArrayProperty<int>((string *)&values,&obj_13->audioEmitters,pbVar14);
        std::__cxx11::string::~string((string *)&values);
      }
      if (indices.m_type == null) {
        detail::JsonSetObject(&indices);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back(&sparse,&indices);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&indices);
    }
    detail::JsonAddMember(o,"scenes",&sparse);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&sparse);
  }
  if ((model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
      super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&values,(nullptr_t)0x0);
    for (uVar31 = 0;
        (ulong)uVar31 <
        (ulong)(((long)(model->skins).
                       super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(model->skins).
                      super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x148); uVar31 = uVar31 + 1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&sparse,(nullptr_t)0x0);
      obj_15 = (model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
      std::__cxx11::string::string((string *)&type,"joints",(allocator *)&indices);
      SerializeNumberArrayProperty<int>(&type,&obj_15->joints,&sparse);
      std::__cxx11::string::~string((string *)&type);
      if (-1 < obj_15->inverseBindMatrices) {
        std::__cxx11::string::string((string *)&type,"inverseBindMatrices",(allocator *)&indices);
        SerializeNumberProperty<int>(&type,obj_15->inverseBindMatrices,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if (-1 < obj_15->skeleton) {
        std::__cxx11::string::string((string *)&type,"skeleton",(allocator *)&indices);
        SerializeNumberProperty<int>(&type,obj_15->skeleton,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if ((obj_15->name)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"name",(allocator *)&indices);
        SerializeStringProperty(&type,&obj_15->name,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      SerializeExtrasAndExtensions<tinygltf::Skin>(obj_15,&sparse);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&values,&sparse);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&sparse);
    }
    detail::JsonAddMember(o,"skins",(json *)&values);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&values);
  }
  if ((model->textures).super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->textures).super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&values,(nullptr_t)0x0);
    for (uVar31 = 0; uVar19 = (ulong)uVar31,
        uVar19 < (ulong)(((long)(model->textures).
                                super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(model->textures).
                               super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x130);
        uVar31 = uVar31 + 1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&sparse,(nullptr_t)0x0);
      pTVar5 = (model->textures).
               super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
               super__Vector_impl_data._M_start;
      obj_06 = pTVar5 + uVar19;
      if (-1 < pTVar5[uVar19].sampler) {
        std::__cxx11::string::string((string *)&type,"sampler",(allocator *)&indices);
        SerializeNumberProperty<int>(&type,obj_06->sampler,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if (-1 < obj_06->source) {
        std::__cxx11::string::string((string *)&type,"source",(allocator *)&indices);
        SerializeNumberProperty<int>(&type,obj_06->source,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if ((obj_06->name)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"name",(allocator *)&indices);
        SerializeStringProperty(&type,&obj_06->name,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      SerializeExtrasAndExtensions<tinygltf::Texture>(obj_06,&sparse);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&values,&sparse);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&sparse);
    }
    detail::JsonAddMember(o,"textures",(json *)&values);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&values);
  }
  if ((model->samplers).super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->samplers).super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&values,(nullptr_t)0x0);
    for (uVar31 = 0; uVar19 = (ulong)uVar31,
        uVar19 < (ulong)(((long)(model->samplers).
                                super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(model->samplers).
                               super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x138);
        uVar31 = uVar31 + 1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&sparse,(nullptr_t)0x0);
      pSVar6 = (model->samplers).
               super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>._M_impl.
               super__Vector_impl_data._M_start;
      obj_07 = pSVar6 + uVar19;
      if (pSVar6[uVar19].name._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"name",(allocator *)&indices);
        SerializeStringProperty(&type,&obj_07->name,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if (obj_07->magFilter != -1) {
        std::__cxx11::string::string((string *)&type,"magFilter",(allocator *)&indices);
        SerializeNumberProperty<int>(&type,obj_07->magFilter,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if (obj_07->minFilter != -1) {
        std::__cxx11::string::string((string *)&type,"minFilter",(allocator *)&indices);
        SerializeNumberProperty<int>(&type,obj_07->minFilter,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      std::__cxx11::string::string((string *)&type,"wrapS",(allocator *)&indices);
      SerializeNumberProperty<int>(&type,obj_07->wrapS,&sparse);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::string((string *)&type,"wrapT",(allocator *)&indices);
      SerializeNumberProperty<int>(&type,obj_07->wrapT,&sparse);
      std::__cxx11::string::~string((string *)&type);
      SerializeExtrasAndExtensions<tinygltf::Sampler>(obj_07,&sparse);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&values,&sparse);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&sparse);
    }
    detail::JsonAddMember(o,"samplers",(json *)&values);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&values);
  }
  if ((model->cameras).super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->cameras).super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&sparse,(nullptr_t)0x0);
    for (uVar31 = 0;
        (ulong)uVar31 <
        (ulong)(((long)(model->cameras).
                       super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(model->cameras).
                      super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x398); uVar31 = uVar31 + 1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&indices,(nullptr_t)0x0);
      obj_14 = (model->cameras).
               super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>._M_impl.
               super__Vector_impl_data._M_start + uVar31;
      std::__cxx11::string::string((string *)&type,"type",(allocator *)&values);
      SerializeStringProperty(&type,&obj_14->type,&indices);
      std::__cxx11::string::~string((string *)&type);
      if ((obj_14->name)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"name",(allocator *)&values);
        SerializeStringProperty(&type,&obj_14->name,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      iVar13 = std::__cxx11::string::compare((char *)obj_14);
      if (iVar13 == 0) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values,(nullptr_t)0x0);
        std::__cxx11::string::string((string *)&type,"zfar",(allocator *)&extensionsUsed);
        SerializeNumberProperty<double>
                  (&type,(obj_14->orthographic).zfar,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values);
        std::__cxx11::string::~string((string *)&type);
        std::__cxx11::string::string((string *)&type,"znear",(allocator *)&extensionsUsed);
        SerializeNumberProperty<double>
                  (&type,(obj_14->orthographic).znear,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values);
        std::__cxx11::string::~string((string *)&type);
        std::__cxx11::string::string((string *)&type,"xmag",(allocator *)&extensionsUsed);
        SerializeNumberProperty<double>
                  (&type,(obj_14->orthographic).xmag,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values);
        std::__cxx11::string::~string((string *)&type);
        std::__cxx11::string::string((string *)&type,"ymag",(allocator *)&extensionsUsed);
        SerializeNumberProperty<double>
                  (&type,(obj_14->orthographic).ymag,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values);
        std::__cxx11::string::~string((string *)&type);
        SerializeExtrasAndExtensions<tinygltf::OrthographicCamera>
                  (&obj_14->orthographic,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values);
        detail::JsonAddMember
                  (&indices,"orthographic",
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values);
LAB_0011b42b:
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&values);
      }
      else {
        iVar13 = std::__cxx11::string::compare((char *)obj_14);
        if (iVar13 == 0) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values,(nullptr_t)0x0);
          std::__cxx11::string::string((string *)&type,"zfar",(allocator *)&extensionsUsed);
          SerializeNumberProperty<double>
                    (&type,(obj_14->perspective).zfar,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values);
          std::__cxx11::string::~string((string *)&type);
          std::__cxx11::string::string((string *)&type,"znear",(allocator *)&extensionsUsed);
          SerializeNumberProperty<double>
                    (&type,(obj_14->perspective).znear,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values);
          obj = &obj_14->perspective;
          std::__cxx11::string::~string((string *)&type);
          if (0.0 < obj->aspectRatio) {
            std::__cxx11::string::string((string *)&type,"aspectRatio",(allocator *)&extensionsUsed)
            ;
            SerializeNumberProperty<double>
                      (&type,obj->aspectRatio,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values);
            std::__cxx11::string::~string((string *)&type);
          }
          if (0.0 < (obj_14->perspective).yfov) {
            std::__cxx11::string::string((string *)&type,"yfov",(allocator *)&extensionsUsed);
            SerializeNumberProperty<double>
                      (&type,(obj_14->perspective).yfov,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&values);
            std::__cxx11::string::~string((string *)&type);
          }
          SerializeExtrasAndExtensions<tinygltf::PerspectiveCamera>
                    (obj,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&values);
          detail::JsonAddMember
                    (&indices,"perspective",
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values);
          goto LAB_0011b42b;
        }
      }
      SerializeExtrasAndExtensions<tinygltf::Camera>(obj_14,&indices);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back(&sparse,&indices);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&indices);
    }
    detail::JsonAddMember(o,"cameras",&sparse);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&sparse);
  }
  SerializeExtrasAndExtensions<tinygltf::Model>(model,o);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&extensionsUsed,&model->extensionsUsed);
  if ((model->lights).super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->lights).super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>._M_impl.
      super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&sparse,(nullptr_t)0x0);
    for (uVar31 = 0; uVar19 = (ulong)uVar31,
        uVar19 < (ulong)(((long)(model->lights).
                                super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(model->lights).
                               super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x288);
        uVar31 = uVar31 + 1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&indices,(nullptr_t)0x0);
      pLVar7 = (model->lights).super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>
               ._M_impl.super__Vector_impl_data._M_start;
      obj_08 = pLVar7 + uVar19;
      if (pLVar7[uVar19].name._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"name",(allocator *)&values);
        SerializeStringProperty(&type,&obj_08->name,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      std::__cxx11::string::string((string *)&type,"intensity",(allocator *)&values);
      SerializeNumberProperty<double>(&type,obj_08->intensity,&indices);
      std::__cxx11::string::~string((string *)&type);
      if (0.0 < obj_08->range) {
        std::__cxx11::string::string((string *)&type,"range",(allocator *)&values);
        SerializeNumberProperty<double>(&type,obj_08->range,&indices);
        std::__cxx11::string::~string((string *)&type);
      }
      std::__cxx11::string::string((string *)&type,"color",(allocator *)&values);
      SerializeNumberArrayProperty<double>(&type,&obj_08->color,&indices);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::string((string *)&type,"type",(allocator *)&values);
      SerializeStringProperty(&type,&obj_08->type,&indices);
      std::__cxx11::string::~string((string *)&type);
      bVar12 = std::operator==(&obj_08->type,"spot");
      if (bVar12) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values,(nullptr_t)0x0);
        std::__cxx11::string::string((string *)&type,"innerConeAngle",(allocator *)&animation);
        SerializeNumberProperty<double>
                  (&type,(obj_08->spot).innerConeAngle,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values);
        std::__cxx11::string::~string((string *)&type);
        std::__cxx11::string::string((string *)&type,"outerConeAngle",(allocator *)&animation);
        SerializeNumberProperty<double>
                  (&type,(obj_08->spot).outerConeAngle,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values);
        std::__cxx11::string::~string((string *)&type);
        SerializeExtrasAndExtensions<tinygltf::SpotLight>
                  (&obj_08->spot,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values);
        detail::JsonAddMember
                  (&indices,"spot",
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&values);
      }
      SerializeExtrasAndExtensions<tinygltf::Light>(obj_08,&indices);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back(&sparse,&indices);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&indices);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&values,(nullptr_t)0x0);
    detail::JsonAddMember
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&values,"lights",&sparse);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&indices,(nullptr_t)0x0);
    type._M_dataplus._M_p = (pointer)0x0;
    type._M_string_length = 0;
    type.field_2._M_allocated_capacity = 0;
    type.field_2._8_8_ = 0x8000000000000000;
    bVar12 = detail::FindMember(o,"extensions",(json_const_iterator *)&type);
    if (bVar12) {
      pbVar17 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&type);
      detail::JsonAssign(&indices,pbVar17);
    }
    detail::JsonAddMember(&indices,"KHR_lights_punctual",(json *)&values);
    pcVar21 = "extensions";
    detail::JsonAddMember(o,"extensions",&indices);
    pbVar11 = extensionsUsed.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar25 = (long)extensionsUsed.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)extensionsUsed.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pbVar20 = extensionsUsed.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (lVar26 = lVar25 >> 7; 0 < lVar26; lVar26 = lVar26 + -1) {
      bVar12 = __gnu_cxx::__ops::
               _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_0>
               ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__0>
                             *)pbVar20,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )pcVar21);
      pbVar30 = pbVar20;
      if (bVar12) goto LAB_0011b840;
      bVar12 = __gnu_cxx::__ops::
               _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_0>
               ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__0>
                             *)(pbVar20 + 1),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )pcVar21);
      pbVar30 = pbVar20 + 1;
      if (bVar12) goto LAB_0011b840;
      bVar12 = __gnu_cxx::__ops::
               _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_0>
               ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__0>
                             *)(pbVar20 + 2),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )pcVar21);
      pbVar30 = pbVar20 + 2;
      if (bVar12) goto LAB_0011b840;
      bVar12 = __gnu_cxx::__ops::
               _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_0>
               ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__0>
                             *)(pbVar20 + 3),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )pcVar21);
      pbVar30 = pbVar20 + 3;
      if (bVar12) goto LAB_0011b840;
      pbVar20 = pbVar20 + 4;
      lVar25 = lVar25 + -0x80;
    }
    lVar25 = lVar25 >> 5;
    if (lVar25 == 1) {
LAB_0011c362:
      bVar12 = __gnu_cxx::__ops::
               _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_0>
               ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__0>
                             *)pbVar20,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )pcVar21);
      pbVar30 = pbVar11;
      if (bVar12) {
        pbVar30 = pbVar20;
      }
    }
    else if (lVar25 == 2) {
LAB_0011b823:
      bVar12 = __gnu_cxx::__ops::
               _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_0>
               ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__0>
                             *)pbVar20,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )pcVar21);
      pbVar30 = pbVar20;
      if (!bVar12) {
        pbVar20 = pbVar20 + 1;
        goto LAB_0011c362;
      }
    }
    else {
      pbVar30 = pbVar11;
      if ((lVar25 == 3) &&
         (bVar12 = __gnu_cxx::__ops::
                   _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_0>
                   ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__0>
                                 *)pbVar20,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )pcVar21), pbVar30 = pbVar20, !bVar12)) {
        pbVar20 = pbVar20 + 1;
        goto LAB_0011b823;
      }
    }
LAB_0011b840:
    if (pbVar30 ==
        extensionsUsed.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&type,"KHR_lights_punctual",(allocator *)&animation);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &extensionsUsed,&type);
      std::__cxx11::string::~string((string *)&type);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&indices);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&values);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&sparse);
  }
  if (((model->audioEmitters).
       super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (model->audioEmitters).
       super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((model->audioSources).
      super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (model->audioSources).
      super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&animation,(nullptr_t)0x0);
    for (uVar31 = 0; uVar19 = (ulong)uVar31,
        uVar19 < (ulong)(((long)(model->audioEmitters).
                                super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(model->audioEmitters).
                               super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x2b8);
        uVar31 = uVar31 + 1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&sparse,(nullptr_t)0x0);
      pAVar8 = (model->audioEmitters).
               super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>.
               _M_impl.super__Vector_impl_data._M_start;
      obj_09 = pAVar8 + uVar19;
      if (pAVar8[uVar19].name._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"name",(allocator *)&values);
        SerializeStringProperty(&type,&obj_09->name,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if (1e-12 <= ABS(1.0 - obj_09->gain)) {
        std::__cxx11::string::string((string *)&type,"gain",(allocator *)&values);
        SerializeNumberProperty<double>(&type,obj_09->gain,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if (obj_09->loop == true) {
        std::__cxx11::string::string((string *)&type,"loop",(allocator *)&values);
        SerializeNumberProperty<bool>(&type,obj_09->loop,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if (obj_09->playing == true) {
        std::__cxx11::string::string((string *)&type,"playing",(allocator *)&values);
        SerializeNumberProperty<bool>(&type,obj_09->playing,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if ((obj_09->type)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"type",(allocator *)&values);
        SerializeStringProperty(&type,&obj_09->type,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      if ((obj_09->distanceModel)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&type,"distanceModel",(allocator *)&values);
        SerializeStringProperty(&type,&obj_09->distanceModel,&sparse);
        std::__cxx11::string::~string((string *)&type);
      }
      bVar12 = std::operator==(&obj_09->type,"positional");
      if (bVar12) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values,(nullptr_t)0x0);
        if (1e-12 <= ABS(6.283185307179586 - (obj_09->positional).coneInnerAngle)) {
          std::__cxx11::string::string((string *)&type,"coneInnerAngle",(allocator *)&indices);
          SerializeNumberProperty<double>
                    (&type,(obj_09->positional).coneInnerAngle,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values);
          std::__cxx11::string::~string((string *)&type);
        }
        if (1e-12 <= ABS(6.283185307179586 - (obj_09->positional).coneOuterAngle)) {
          std::__cxx11::string::string((string *)&type,"coneOuterAngle",(allocator *)&indices);
          SerializeNumberProperty<double>
                    (&type,(obj_09->positional).coneOuterAngle,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values);
          std::__cxx11::string::~string((string *)&type);
        }
        if (0.0 < (obj_09->positional).coneOuterGain) {
          std::__cxx11::string::string((string *)&type,"coneOuterGain",(allocator *)&indices);
          SerializeNumberProperty<double>
                    (&type,(obj_09->positional).coneOuterGain,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values);
          std::__cxx11::string::~string((string *)&type);
        }
        if (1e-12 <= ABS(100.0 - (obj_09->positional).maxDistance)) {
          std::__cxx11::string::string((string *)&type,"maxDistance",(allocator *)&indices);
          SerializeNumberProperty<double>
                    (&type,(obj_09->positional).maxDistance,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values);
          std::__cxx11::string::~string((string *)&type);
        }
        if (1e-12 <= ABS(1.0 - (obj_09->positional).refDistance)) {
          std::__cxx11::string::string((string *)&type,"refDistance",(allocator *)&indices);
          SerializeNumberProperty<double>
                    (&type,(obj_09->positional).refDistance,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values);
          std::__cxx11::string::~string((string *)&type);
        }
        if (1e-12 <= ABS(1.0 - (obj_09->positional).rolloffFactor)) {
          std::__cxx11::string::string((string *)&type,"rolloffFactor",(allocator *)&indices);
          SerializeNumberProperty<double>
                    (&type,(obj_09->positional).rolloffFactor,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&values);
          std::__cxx11::string::~string((string *)&type);
        }
        SerializeExtrasAndExtensions<tinygltf::PositionalEmitter>
                  (&obj_09->positional,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values);
        detail::JsonAddMember
                  (&sparse,"positional",
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&values);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&values);
      }
      std::__cxx11::string::string((string *)&type,"source",(allocator *)&values);
      SerializeNumberProperty<int>(&type,obj_09->source,&sparse);
      std::__cxx11::string::~string((string *)&type);
      SerializeExtrasAndExtensions<tinygltf::AudioEmitter>(obj_09,&sparse);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back(&animation,&sparse);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&sparse);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&mesh,(nullptr_t)0x0);
    detail::JsonAddMember(&mesh,"emitters",&animation);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&sources,(nullptr_t)0x0);
    for (uVar31 = 0; uVar19 = (ulong)uVar31,
        uVar19 < (ulong)(((long)(model->audioSources).
                                super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(model->audioSources).
                               super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x170);
        uVar31 = uVar31 + 1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&source,(nullptr_t)0x0);
      pAVar9 = (model->audioSources).
               super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>.
               _M_impl.super__Vector_impl_data._M_start;
      obj_10 = pAVar9 + uVar19;
      type._M_dataplus._M_p = (pointer)&type.field_2;
      type._M_string_length = 0;
      type.field_2._M_allocated_capacity = type.field_2._M_allocated_capacity & 0xffffffffffffff00;
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      sparse._0_8_ = local_310;
      sparse.m_value.object = (object_t *)0x0;
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((ulong)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      local_310[0] = 0;
      if (pAVar9[uVar19].name._M_string_length != 0) {
        std::__cxx11::string::string((string *)&indices,"name",&local_2b1);
        SerializeStringProperty((string *)&indices,&obj_10->name,&source);
        std::__cxx11::string::~string((string *)&indices);
      }
      if ((obj_10->uri)._M_string_length == 0) {
        std::__cxx11::string::string((string *)&indices,"mimeType",&local_2b1);
        SerializeStringProperty((string *)&indices,&obj_10->mimeType,&source);
        std::__cxx11::string::~string((string *)&indices);
        std::__cxx11::string::string((string *)&indices,"bufferView",&local_2b1);
        SerializeNumberProperty<int>((string *)&indices,obj_10->bufferView,&source);
      }
      else {
        std::__cxx11::string::string((string *)&indices,"uri",&local_2b1);
        SerializeStringProperty((string *)&indices,&obj_10->uri,&source);
      }
      std::__cxx11::string::~string((string *)&indices);
      SerializeExtrasAndExtensions<tinygltf::AudioSource>(obj_10,&source);
      std::__cxx11::string::~string((string *)&sparse);
      std::__cxx11::string::~string((string *)&values);
      std::__cxx11::string::~string((string *)&type);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back(&sources,&source);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&source);
    }
    detail::JsonAddMember(&mesh,"sources",&sources);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&values,(nullptr_t)0x0);
    type._M_dataplus._M_p = (pointer)0x0;
    type._M_string_length = 0;
    type.field_2._M_allocated_capacity = 0;
    type.field_2._8_8_ = 0x8000000000000000;
    bVar12 = detail::FindMember(o,"extensions",(json_const_iterator *)&type);
    if (bVar12) {
      pbVar17 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&type);
      detail::JsonAssign((json *)&values,pbVar17);
    }
    detail::JsonAddMember((json *)&values,"KHR_audio",&mesh);
    pcVar21 = "extensions";
    detail::JsonAddMember(o,"extensions",(json *)&values);
    pbVar11 = extensionsUsed.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar25 = (long)extensionsUsed.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)extensionsUsed.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pbVar20 = extensionsUsed.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (lVar26 = lVar25 >> 7; 0 < lVar26; lVar26 = lVar26 + -1) {
      bVar12 = __gnu_cxx::__ops::
               _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_1>
               ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__1>
                             *)pbVar20,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )pcVar21);
      pbVar30 = pbVar20;
      if (bVar12) goto LAB_0011c03d;
      bVar12 = __gnu_cxx::__ops::
               _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_1>
               ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__1>
                             *)(pbVar20 + 1),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )pcVar21);
      pbVar30 = pbVar20 + 1;
      if (bVar12) goto LAB_0011c03d;
      bVar12 = __gnu_cxx::__ops::
               _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_1>
               ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__1>
                             *)(pbVar20 + 2),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )pcVar21);
      pbVar30 = pbVar20 + 2;
      if (bVar12) goto LAB_0011c03d;
      bVar12 = __gnu_cxx::__ops::
               _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_1>
               ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__1>
                             *)(pbVar20 + 3),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )pcVar21);
      pbVar30 = pbVar20 + 3;
      if (bVar12) goto LAB_0011c03d;
      pbVar20 = pbVar20 + 4;
      lVar25 = lVar25 + -0x80;
    }
    lVar25 = lVar25 >> 5;
    if (lVar25 == 1) {
LAB_0011c341:
      bVar12 = __gnu_cxx::__ops::
               _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_1>
               ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__1>
                             *)pbVar20,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )pcVar21);
      pbVar30 = pbVar11;
      if (bVar12) {
        pbVar30 = pbVar20;
      }
    }
    else if (lVar25 == 2) {
LAB_0011c020:
      bVar12 = __gnu_cxx::__ops::
               _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_1>
               ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__1>
                             *)pbVar20,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )pcVar21);
      pbVar30 = pbVar20;
      if (!bVar12) {
        pbVar20 = pbVar20 + 1;
        goto LAB_0011c341;
      }
    }
    else {
      pbVar30 = pbVar11;
      if ((lVar25 == 3) &&
         (bVar12 = __gnu_cxx::__ops::
                   _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_1>
                   ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__1>
                                 *)pbVar20,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )pcVar21), pbVar30 = pbVar20, !bVar12)) {
        pbVar20 = pbVar20 + 1;
        goto LAB_0011c020;
      }
    }
LAB_0011c03d:
    if (pbVar30 ==
        extensionsUsed.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&type,"KHR_audio",(allocator *)&sparse);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &extensionsUsed,&type);
      std::__cxx11::string::~string((string *)&type);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&values);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&sources);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&mesh);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&animation);
  }
  pbVar11 = extensionsUsed.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pNVar23 = (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __it._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar26 = (long)__it._M_current - (long)pNVar23;
  for (lVar25 = lVar26 / 0x1e8 >> 2; 0 < lVar25; lVar25 = lVar25 + -1) {
    pNVar22 = pNVar23;
    if ((pNVar23->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pNVar23->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0011c197;
    if (pNVar23[1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        pNVar23[1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar22 = pNVar23 + 1;
      goto LAB_0011c197;
    }
    if (pNVar23[2].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        pNVar23[2].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar22 = pNVar23 + 2;
      goto LAB_0011c197;
    }
    if (pNVar23[3].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        pNVar23[3].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar22 = pNVar23 + 3;
      goto LAB_0011c197;
    }
    pNVar23 = pNVar23 + 4;
    lVar26 = lVar26 + -0x7a0;
  }
  lVar26 = lVar26 / 0x1e8;
  if (lVar26 == 1) {
LAB_0011c16d:
    pNVar22 = pNVar23;
    if ((pNVar23->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pNVar23->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar22 = (pointer)__it._M_current;
    }
  }
  else if (lVar26 == 2) {
LAB_0011c15c:
    pNVar22 = pNVar23;
    if ((pNVar23->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pNVar23->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar23 = pNVar23 + 1;
      goto LAB_0011c16d;
    }
  }
  else {
    pNVar22 = (pointer)__it._M_current;
    if ((lVar26 == 3) &&
       (pNVar22 = pNVar23,
       (pNVar23->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start ==
       (pNVar23->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish)) {
      pNVar23 = pNVar23 + 1;
      goto LAB_0011c15c;
    }
  }
LAB_0011c197:
  pMVar24 = (model->materials).
            super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar10 = (model->materials).
            super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar26 = (long)pMVar10 - (long)pMVar24;
  for (lVar25 = lVar26 / 0x878 >> 2; 0 < lVar25; lVar25 = lVar25 + -1) {
    pMVar18 = pMVar24;
    if ((pMVar24->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pMVar24->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0011c280;
    if (pMVar24[1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        pMVar24[1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar18 = pMVar24 + 1;
      goto LAB_0011c280;
    }
    if (pMVar24[2].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        pMVar24[2].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar18 = pMVar24 + 2;
      goto LAB_0011c280;
    }
    if (pMVar24[3].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        pMVar24[3].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar18 = pMVar24 + 3;
      goto LAB_0011c280;
    }
    pMVar24 = pMVar24 + 4;
    lVar26 = lVar26 + -0x21e0;
  }
  lVar26 = lVar26 / 0x878;
  if (lVar26 == 1) {
LAB_0011c256:
    pMVar18 = pMVar24;
    if ((pMVar24->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pMVar24->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar18 = pMVar10;
    }
  }
  else if (lVar26 == 2) {
LAB_0011c245:
    pMVar18 = pMVar24;
    if ((pMVar24->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pMVar24->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar24 = pMVar24 + 1;
      goto LAB_0011c256;
    }
  }
  else {
    pMVar18 = pMVar10;
    if ((lVar26 == 3) &&
       (pMVar18 = pMVar24,
       (pMVar24->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start ==
       (pMVar24->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish)) {
      pMVar24 = pMVar24 + 1;
      goto LAB_0011c245;
    }
  }
LAB_0011c280:
  if ((pNVar22 == (pointer)__it._M_current) && (pMVar18 == pMVar10)) goto LAB_0011c3cc;
  lVar25 = (long)extensionsUsed.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)extensionsUsed.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pbVar20 = extensionsUsed.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (lVar26 = lVar25 >> 7; 0 < lVar26; lVar26 = lVar26 + -1) {
    bVar12 = __gnu_cxx::__ops::
             _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_4>
             ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__4>
                           *)pbVar20,__it);
    pbVar30 = pbVar20;
    if (bVar12) goto LAB_0011c38d;
    bVar12 = __gnu_cxx::__ops::
             _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_4>
             ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__4>
                           *)(pbVar20 + 1),__it);
    pbVar30 = pbVar20 + 1;
    if (bVar12) goto LAB_0011c38d;
    bVar12 = __gnu_cxx::__ops::
             _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_4>
             ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__4>
                           *)(pbVar20 + 2),__it);
    pbVar30 = pbVar20 + 2;
    if (bVar12) goto LAB_0011c38d;
    bVar12 = __gnu_cxx::__ops::
             _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_4>
             ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__4>
                           *)(pbVar20 + 3),__it);
    pbVar30 = pbVar20 + 3;
    if (bVar12) goto LAB_0011c38d;
    pbVar20 = pbVar20 + 4;
    lVar25 = lVar25 + -0x80;
  }
  lVar25 = lVar25 >> 5;
  if (lVar25 == 1) {
LAB_0011c37c:
    bVar12 = __gnu_cxx::__ops::
             _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_4>
             ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__4>
                           *)pbVar20,__it);
    pbVar30 = pbVar11;
    if (bVar12) {
      pbVar30 = pbVar20;
    }
  }
  else if (lVar25 == 2) {
LAB_0011c325:
    bVar12 = __gnu_cxx::__ops::
             _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_4>
             ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__4>
                           *)pbVar20,__it);
    pbVar30 = pbVar20;
    if (!bVar12) {
      pbVar20 = pbVar20 + 1;
      goto LAB_0011c37c;
    }
  }
  else {
    pbVar30 = pbVar11;
    if ((lVar25 == 3) &&
       (bVar12 = __gnu_cxx::__ops::
                 _Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::$_4>
                 ::operator()((_Iter_pred<tinygltf::SerializeGltfModel(tinygltf::Model_const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__4>
                               *)pbVar20,__it), pbVar30 = pbVar20, !bVar12)) {
      pbVar20 = pbVar20 + 1;
      goto LAB_0011c325;
    }
  }
LAB_0011c38d:
  if (pbVar30 ==
      extensionsUsed.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&type,"MSFT_lod",(allocator *)&values);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&extensionsUsed,
               &type);
    std::__cxx11::string::~string((string *)&type);
  }
LAB_0011c3cc:
  if (extensionsUsed.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      extensionsUsed.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string((string *)&type,"extensionsUsed",(allocator *)&values);
    SerializeStringArrayProperty(&type,&extensionsUsed,o);
    std::__cxx11::string::~string((string *)&type);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&extensionsUsed);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&asset);
  return;
}

Assistant:

static void SerializeGltfModel(const Model *model, detail::json &o) {
  // ACCESSORS
  if (model->accessors.size()) {
    detail::json accessors;
    detail::JsonReserveArray(accessors, model->accessors.size());
    for (unsigned int i = 0; i < model->accessors.size(); ++i) {
      detail::json accessor;
      SerializeGltfAccessor(model->accessors[i], accessor);
      detail::JsonPushBack(accessors, std::move(accessor));
    }
    detail::JsonAddMember(o, "accessors", std::move(accessors));
  }

  // ANIMATIONS
  if (model->animations.size()) {
    detail::json animations;
    detail::JsonReserveArray(animations, model->animations.size());
    for (unsigned int i = 0; i < model->animations.size(); ++i) {
      if (model->animations[i].channels.size()) {
        detail::json animation;
        SerializeGltfAnimation(model->animations[i], animation);
        detail::JsonPushBack(animations, std::move(animation));
      }
    }

    detail::JsonAddMember(o, "animations", std::move(animations));
  }

  // ASSET
  detail::json asset;
  SerializeGltfAsset(model->asset, asset);
  detail::JsonAddMember(o, "asset", std::move(asset));

  // BUFFERVIEWS
  if (model->bufferViews.size()) {
    detail::json bufferViews;
    detail::JsonReserveArray(bufferViews, model->bufferViews.size());
    for (unsigned int i = 0; i < model->bufferViews.size(); ++i) {
      detail::json bufferView;
      SerializeGltfBufferView(model->bufferViews[i], bufferView);
      detail::JsonPushBack(bufferViews, std::move(bufferView));
    }
    detail::JsonAddMember(o, "bufferViews", std::move(bufferViews));
  }

  // Extensions required
  if (model->extensionsRequired.size()) {
    SerializeStringArrayProperty("extensionsRequired",
                                 model->extensionsRequired, o);
  }

  // MATERIALS
  if (model->materials.size()) {
    detail::json materials;
    detail::JsonReserveArray(materials, model->materials.size());
    for (unsigned int i = 0; i < model->materials.size(); ++i) {
      detail::json material;
      SerializeGltfMaterial(model->materials[i], material);

      if (detail::JsonIsNull(material)) {
        // Issue 294.
        // `material` does not have any required parameters
        // so the result may be null(unmodified) when all material parameters
        // have default value.
        //
        // null is not allowed thus we create an empty JSON object.
        detail::JsonSetObject(material);
      }
      detail::JsonPushBack(materials, std::move(material));
    }
    detail::JsonAddMember(o, "materials", std::move(materials));
  }

  // MESHES
  if (model->meshes.size()) {
    detail::json meshes;
    detail::JsonReserveArray(meshes, model->meshes.size());
    for (unsigned int i = 0; i < model->meshes.size(); ++i) {
      detail::json mesh;
      SerializeGltfMesh(model->meshes[i], mesh);
      detail::JsonPushBack(meshes, std::move(mesh));
    }
    detail::JsonAddMember(o, "meshes", std::move(meshes));
  }

  // NODES
  if (model->nodes.size()) {
    detail::json nodes;
    detail::JsonReserveArray(nodes, model->nodes.size());
    for (unsigned int i = 0; i < model->nodes.size(); ++i) {
      detail::json node;
      SerializeGltfNode(model->nodes[i], node);

      if (detail::JsonIsNull(node)) {
        // Issue 457.
        // `node` does not have any required parameters,
        // so the result may be null(unmodified) when all node parameters
        // have default value.
        //
        // null is not allowed thus we create an empty JSON object.
        detail::JsonSetObject(node);
      }
      detail::JsonPushBack(nodes, std::move(node));
    }
    detail::JsonAddMember(o, "nodes", std::move(nodes));
  }

  // SCENE
  if (model->defaultScene > -1) {
    SerializeNumberProperty<int>("scene", model->defaultScene, o);
  }

  // SCENES
  if (model->scenes.size()) {
    detail::json scenes;
    detail::JsonReserveArray(scenes, model->scenes.size());
    for (unsigned int i = 0; i < model->scenes.size(); ++i) {
      detail::json currentScene;
      SerializeGltfScene(model->scenes[i], currentScene);
      if (detail::JsonIsNull(currentScene)) {
        // Issue 464.
        // `scene` does not have any required parameters,
        // so the result may be null(unmodified) when all scene parameters
        // have default value.
        //
        // null is not allowed thus we create an empty JSON object.
        detail::JsonSetObject(currentScene);
      }
      detail::JsonPushBack(scenes, std::move(currentScene));
    }
    detail::JsonAddMember(o, "scenes", std::move(scenes));
  }

  // SKINS
  if (model->skins.size()) {
    detail::json skins;
    detail::JsonReserveArray(skins, model->skins.size());
    for (unsigned int i = 0; i < model->skins.size(); ++i) {
      detail::json skin;
      SerializeGltfSkin(model->skins[i], skin);
      detail::JsonPushBack(skins, std::move(skin));
    }
    detail::JsonAddMember(o, "skins", std::move(skins));
  }

  // TEXTURES
  if (model->textures.size()) {
    detail::json textures;
    detail::JsonReserveArray(textures, model->textures.size());
    for (unsigned int i = 0; i < model->textures.size(); ++i) {
      detail::json texture;
      SerializeGltfTexture(model->textures[i], texture);
      detail::JsonPushBack(textures, std::move(texture));
    }
    detail::JsonAddMember(o, "textures", std::move(textures));
  }

  // SAMPLERS
  if (model->samplers.size()) {
    detail::json samplers;
    detail::JsonReserveArray(samplers, model->samplers.size());
    for (unsigned int i = 0; i < model->samplers.size(); ++i) {
      detail::json sampler;
      SerializeGltfSampler(model->samplers[i], sampler);
      detail::JsonPushBack(samplers, std::move(sampler));
    }
    detail::JsonAddMember(o, "samplers", std::move(samplers));
  }

  // CAMERAS
  if (model->cameras.size()) {
    detail::json cameras;
    detail::JsonReserveArray(cameras, model->cameras.size());
    for (unsigned int i = 0; i < model->cameras.size(); ++i) {
      detail::json camera;
      SerializeGltfCamera(model->cameras[i], camera);
      detail::JsonPushBack(cameras, std::move(camera));
    }
    detail::JsonAddMember(o, "cameras", std::move(cameras));
  }

  // EXTRAS & EXTENSIONS
  SerializeExtrasAndExtensions(*model, o);

  auto extensionsUsed = model->extensionsUsed;

  // LIGHTS as KHR_lights_punctual
  if (model->lights.size()) {
    detail::json lights;
    detail::JsonReserveArray(lights, model->lights.size());
    for (unsigned int i = 0; i < model->lights.size(); ++i) {
      detail::json light;
      SerializeGltfLight(model->lights[i], light);
      detail::JsonPushBack(lights, std::move(light));
    }
    detail::json khr_lights_cmn;
    detail::JsonAddMember(khr_lights_cmn, "lights", std::move(lights));
    detail::json ext_j;

    {
      detail::json_const_iterator it;
      if (detail::FindMember(o, "extensions", it)) {
        detail::JsonAssign(ext_j, detail::GetValue(it));
      }
    }

    detail::JsonAddMember(ext_j, "KHR_lights_punctual",
                          std::move(khr_lights_cmn));

    detail::JsonAddMember(o, "extensions", std::move(ext_j));

    // Also add "KHR_lights_punctual" to `extensionsUsed`
    {
      auto has_khr_lights_punctual =
          std::find_if(extensionsUsed.begin(), extensionsUsed.end(),
                       [](const std::string &s) {
                         return (s.compare("KHR_lights_punctual") == 0);
                       });

      if (has_khr_lights_punctual == extensionsUsed.end()) {
        extensionsUsed.push_back("KHR_lights_punctual");
      }
    }
  }

  // KHR_audio
  if (!model->audioEmitters.empty() || !model->audioSources.empty()) {
    detail::json emitters;
    detail::JsonReserveArray(emitters, model->audioEmitters.size());
    for (unsigned int i = 0; i < model->audioEmitters.size(); ++i) {
      detail::json emitter;
      SerializeGltfAudioEmitter(model->audioEmitters[i], emitter);
      detail::JsonPushBack(emitters, std::move(emitter));
    }
    detail::json khr_audio_cmn;
    detail::JsonAddMember(khr_audio_cmn, "emitters", std::move(emitters));

    detail::json sources;
    detail::JsonReserveArray(sources, model->audioSources.size());
    for (unsigned int i = 0; i < model->audioSources.size(); ++i) {
      detail::json source;
      SerializeGltfAudioSource(model->audioSources[i], source);
      detail::JsonPushBack(sources, std::move(source));
    }
    detail::JsonAddMember(khr_audio_cmn, "sources", std::move(sources));

    detail::json ext_j;
    {
      detail::json_const_iterator it;
      if (detail::FindMember(o, "extensions", it)) {
        detail::JsonAssign(ext_j, detail::GetValue(it));
      }
    }

    detail::JsonAddMember(ext_j, "KHR_audio", std::move(khr_audio_cmn));

    detail::JsonAddMember(o, "extensions", std::move(ext_j));

    // Also add "KHR_audio" to `extensionsUsed`
    {
      auto has_khr_audio = std::find_if(
          extensionsUsed.begin(), extensionsUsed.end(),
          [](const std::string &s) { return (s.compare("KHR_audio") == 0); });

      if (has_khr_audio == extensionsUsed.end()) {
        extensionsUsed.push_back("KHR_audio");
      }
    }
  }

  // MSFT_lod

  // Look if there is a node that employs MSFT_lod
  auto msft_lod_nodes_it = std::find_if(
    model->nodes.begin(), model->nodes.end(),
    [](const Node& node) { return !node.lods.empty(); });

  // Look if there is a material that employs MSFT_lod
  auto msft_lod_materials_it = std::find_if(
    model->materials.begin(), model->materials.end(),
    [](const Material& material) {return !material.lods.empty(); });

  // If either a node or a material employ MSFT_lod, then we need
  // to add MSFT_lod to the list of used extensions.
  if (msft_lod_nodes_it != model->nodes.end() || msft_lod_materials_it != model->materials.end()) {
    // First check if MSFT_lod is already registered as used extension
    auto has_msft_lod = std::find_if(
      extensionsUsed.begin(), extensionsUsed.end(),
      [](const std::string &s) { return (s.compare("MSFT_lod") == 0); });

    // If MSFT_lod is not registered yet, add it
    if (has_msft_lod == extensionsUsed.end()) {
      extensionsUsed.push_back("MSFT_lod");
    }
  }

  // Extensions used
  if (extensionsUsed.size()) {
    SerializeStringArrayProperty("extensionsUsed", extensionsUsed, o);
  }
}